

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O0

EVP_PKEY * EVP_PKEY_new(void)

{
  EVP_PKEY *ret;
  
  ret = (EVP_PKEY *)OPENSSL_zalloc(0x18);
  if (ret == (EVP_PKEY *)0x0) {
    ret = (EVP_PKEY *)0x0;
  }
  else {
    ret->type = 0;
    ret->references = 1;
  }
  return (EVP_PKEY *)ret;
}

Assistant:

EVP_PKEY *EVP_PKEY_new(void) {
  EVP_PKEY *ret =
      reinterpret_cast<EVP_PKEY *>(OPENSSL_zalloc(sizeof(EVP_PKEY)));
  if (ret == NULL) {
    return NULL;
  }

  ret->type = EVP_PKEY_NONE;
  ret->references = 1;
  return ret;
}